

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::
write_padded<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::str_writer<char>>
          (basic_writer<fmt::v6::buffer_range<wchar_t>> *this,format_specs *specs,
          str_writer<char> *f)

{
  wchar_t wVar1;
  undefined8 *puVar2;
  long lVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  wchar_t __tmp;
  long lVar7;
  int *piVar8;
  size_t size;
  byte bVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  char *pcVar13;
  ulong uVar14;
  ulong uVar15;
  buffer<wchar_t> *c;
  int iVar21;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  int iVar28;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  
  uVar14 = (ulong)(uint)specs->width;
  uVar10 = f->size_;
  puVar2 = *(undefined8 **)this;
  lVar11 = puVar2[2];
  uVar15 = uVar14 - uVar10;
  if (uVar14 < uVar10 || uVar15 == 0) {
    uVar14 = lVar11 + uVar10;
    if ((ulong)puVar2[3] < uVar14) {
      (**(code **)*puVar2)(puVar2,uVar14);
      uVar10 = f->size_;
    }
    puVar2[2] = uVar14;
    if (0 < (long)uVar10) {
      lVar3 = puVar2[1];
      pcVar13 = f->s;
      uVar10 = uVar10 + 1;
      lVar7 = 0;
      do {
        *(int *)(lVar11 * 4 + lVar3 + lVar7 * 4) = (int)pcVar13[lVar7];
        uVar10 = uVar10 - 1;
        lVar7 = lVar7 + 1;
      } while (1 < uVar10);
    }
  }
  else {
    uVar12 = lVar11 + uVar14;
    if ((ulong)puVar2[3] < uVar12) {
      (**(code **)*puVar2)(puVar2,uVar12);
    }
    puVar2[2] = uVar12;
    auVar6 = _DAT_0019c980;
    auVar5 = _DAT_00199d70;
    auVar4 = _DAT_00197040;
    lVar3 = puVar2[1];
    piVar8 = (int *)(lVar3 + lVar11 * 4);
    wVar1 = (specs->fill).data_[0];
    bVar9 = specs->field_0x9 & 0xf;
    if (bVar9 == 3) {
      uVar12 = uVar15 >> 1;
      if (1 < uVar15) {
        piVar8 = piVar8 + uVar12;
        uVar15 = uVar12 + 0x3fffffffffffffff & 0x3fffffffffffffff;
        auVar26._8_4_ = (int)uVar15;
        auVar26._0_8_ = uVar15;
        auVar26._12_4_ = (int)(uVar15 >> 0x20);
        lVar3 = lVar3 + lVar11 * 4;
        lVar11 = 0;
        auVar26 = auVar26 ^ _DAT_00197040;
        do {
          auVar23._8_4_ = (int)lVar11;
          auVar23._0_8_ = lVar11;
          auVar23._12_4_ = (int)((ulong)lVar11 >> 0x20);
          auVar27 = (auVar23 | auVar5) ^ auVar4;
          iVar21 = auVar26._4_4_;
          if ((bool)(~(auVar27._4_4_ == iVar21 && auVar26._0_4_ < auVar27._0_4_ ||
                      iVar21 < auVar27._4_4_) & 1)) {
            *(wchar_t *)(lVar3 + lVar11 * 4) = wVar1;
          }
          if ((auVar27._12_4_ != auVar26._12_4_ || auVar27._8_4_ <= auVar26._8_4_) &&
              auVar27._12_4_ <= auVar26._12_4_) {
            *(wchar_t *)(lVar3 + 4 + lVar11 * 4) = wVar1;
          }
          auVar23 = (auVar23 | auVar6) ^ auVar4;
          iVar28 = auVar23._4_4_;
          if (iVar28 <= iVar21 && (iVar28 != iVar21 || auVar23._0_4_ <= auVar26._0_4_)) {
            *(wchar_t *)(lVar3 + 8 + lVar11 * 4) = wVar1;
            *(wchar_t *)(lVar3 + 0xc + lVar11 * 4) = wVar1;
          }
          lVar11 = lVar11 + 4;
        } while ((uVar15 - ((uint)(uVar12 + 0x3fffffffffffffff) & 3)) + 4 != lVar11);
      }
      if (0 < (long)f->size_) {
        pcVar13 = f->s;
        uVar15 = f->size_ + 1;
        do {
          *piVar8 = (int)*pcVar13;
          pcVar13 = pcVar13 + 1;
          piVar8 = piVar8 + 1;
          uVar15 = uVar15 - 1;
        } while (1 < uVar15);
      }
      auVar6 = _DAT_0019c980;
      auVar5 = _DAT_00199d70;
      auVar4 = _DAT_00197040;
      uVar14 = (uVar14 * 4 + (uVar10 + uVar12) * -4) - 4;
      auVar27._8_4_ = (int)uVar14;
      auVar27._0_8_ = uVar14;
      auVar27._12_4_ = (int)(uVar14 >> 0x20);
      auVar18._0_8_ = uVar14 >> 2;
      auVar18._8_8_ = auVar27._8_8_ >> 2;
      uVar10 = 0;
      auVar18 = auVar18 ^ _DAT_00197040;
      do {
        auVar24._8_4_ = (int)uVar10;
        auVar24._0_8_ = uVar10;
        auVar24._12_4_ = (int)(uVar10 >> 0x20);
        auVar26 = (auVar24 | auVar5) ^ auVar4;
        iVar21 = auVar18._4_4_;
        if ((bool)(~(auVar26._4_4_ == iVar21 && auVar18._0_4_ < auVar26._0_4_ ||
                    iVar21 < auVar26._4_4_) & 1)) {
          piVar8[uVar10] = wVar1;
        }
        if ((auVar26._12_4_ != auVar18._12_4_ || auVar26._8_4_ <= auVar18._8_4_) &&
            auVar26._12_4_ <= auVar18._12_4_) {
          piVar8[uVar10 + 1] = wVar1;
        }
        auVar26 = (auVar24 | auVar6) ^ auVar4;
        iVar28 = auVar26._4_4_;
        if (iVar28 <= iVar21 && (iVar28 != iVar21 || auVar26._0_4_ <= auVar18._0_4_)) {
          piVar8[uVar10 + 2] = wVar1;
          piVar8[uVar10 + 3] = wVar1;
        }
        uVar10 = uVar10 + 4;
      } while (((uVar14 >> 2) + 4 & 0x7ffffffffffffffc) != uVar10);
    }
    else if (bVar9 == 2) {
      uVar14 = (uVar14 * 4 + uVar10 * -4) - 4;
      auVar16._8_4_ = (int)uVar14;
      auVar16._0_8_ = uVar14;
      auVar16._12_4_ = (int)(uVar14 >> 0x20);
      auVar17._0_8_ = uVar14 >> 2;
      auVar17._8_8_ = auVar16._8_8_ >> 2;
      lVar3 = lVar3 + lVar11 * 4;
      uVar10 = 0;
      auVar17 = auVar17 ^ _DAT_00197040;
      do {
        auVar22._8_4_ = (int)uVar10;
        auVar22._0_8_ = uVar10;
        auVar22._12_4_ = (int)(uVar10 >> 0x20);
        auVar26 = (auVar22 | auVar5) ^ auVar4;
        iVar21 = auVar17._4_4_;
        if ((bool)(~(auVar26._4_4_ == iVar21 && auVar17._0_4_ < auVar26._0_4_ ||
                    iVar21 < auVar26._4_4_) & 1)) {
          *(wchar_t *)(lVar3 + uVar10 * 4) = wVar1;
        }
        if ((auVar26._12_4_ != auVar17._12_4_ || auVar26._8_4_ <= auVar17._8_4_) &&
            auVar26._12_4_ <= auVar17._12_4_) {
          *(wchar_t *)(lVar3 + 4 + uVar10 * 4) = wVar1;
        }
        auVar26 = (auVar22 | auVar6) ^ auVar4;
        iVar28 = auVar26._4_4_;
        if (iVar28 <= iVar21 && (iVar28 != iVar21 || auVar26._0_4_ <= auVar17._0_4_)) {
          *(wchar_t *)(lVar3 + 8 + uVar10 * 4) = wVar1;
          *(wchar_t *)(lVar3 + 0xc + uVar10 * 4) = wVar1;
        }
        uVar10 = uVar10 + 4;
      } while (((uVar14 >> 2) + 4 & 0x7ffffffffffffffc) != uVar10);
      if (0 < (long)f->size_) {
        pcVar13 = f->s;
        uVar10 = f->size_ + 1;
        lVar11 = 0;
        do {
          piVar8[uVar15 + lVar11] = (int)pcVar13[lVar11];
          uVar10 = uVar10 - 1;
          lVar11 = lVar11 + 1;
        } while (1 < uVar10);
      }
    }
    else {
      if (0 < (long)f->size_) {
        pcVar13 = f->s;
        uVar15 = f->size_ + 1;
        do {
          *piVar8 = (int)*pcVar13;
          pcVar13 = pcVar13 + 1;
          piVar8 = piVar8 + 1;
          uVar15 = uVar15 - 1;
        } while (1 < uVar15);
      }
      auVar6 = _DAT_0019c980;
      auVar5 = _DAT_00199d70;
      auVar4 = _DAT_00197040;
      uVar14 = (uVar14 * 4 + uVar10 * -4) - 4;
      auVar19._8_4_ = (int)uVar14;
      auVar19._0_8_ = uVar14;
      auVar19._12_4_ = (int)(uVar14 >> 0x20);
      auVar20._0_8_ = uVar14 >> 2;
      auVar20._8_8_ = auVar19._8_8_ >> 2;
      uVar10 = 0;
      auVar20 = auVar20 ^ _DAT_00197040;
      do {
        auVar25._8_4_ = (int)uVar10;
        auVar25._0_8_ = uVar10;
        auVar25._12_4_ = (int)(uVar10 >> 0x20);
        auVar26 = (auVar25 | auVar5) ^ auVar4;
        iVar21 = auVar20._4_4_;
        if ((bool)(~(auVar26._4_4_ == iVar21 && auVar20._0_4_ < auVar26._0_4_ ||
                    iVar21 < auVar26._4_4_) & 1)) {
          piVar8[uVar10] = wVar1;
        }
        if ((auVar26._12_4_ != auVar20._12_4_ || auVar26._8_4_ <= auVar20._8_4_) &&
            auVar26._12_4_ <= auVar20._12_4_) {
          piVar8[uVar10 + 1] = wVar1;
        }
        auVar26 = (auVar25 | auVar6) ^ auVar4;
        iVar28 = auVar26._4_4_;
        if (iVar28 <= iVar21 && (iVar28 != iVar21 || auVar26._0_4_ <= auVar20._0_4_)) {
          piVar8[uVar10 + 2] = wVar1;
          piVar8[uVar10 + 3] = wVar1;
        }
        uVar10 = uVar10 + 4;
      } while (((uVar14 >> 2) + 4 & 0x7ffffffffffffffc) != uVar10);
    }
  }
  return;
}

Assistant:

void write_padded(const format_specs& specs, F&& f) {
    // User-perceived width (in code points).
    unsigned width = to_unsigned(specs.width);
    size_t size = f.size();  // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points) return f(reserve(size));
    auto&& it = reserve(width + (size - num_code_points));
    char_type fill = specs.fill[0];
    std::size_t padding = width - num_code_points;
    if (specs.align == align::right) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (specs.align == align::center) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }